

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O0

void __thiscall muduo::ThreadPool::ThreadPool(ThreadPool *this,string *nameArg)

{
  string *in_RSI;
  long in_RDI;
  MutexLock *in_stack_ffffffffffffffa8;
  Condition *in_stack_ffffffffffffffb0;
  
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffffb0);
  Condition::Condition(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Condition::Condition(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::string((string *)(in_RDI + 0xa8),in_RSI);
  std::function<void_()>::function((function<void_()> *)in_stack_ffffffffffffffb0);
  std::
  vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  ::vector((vector<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
            *)0x150da4);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::deque
            ((deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)0x150db5);
  *(undefined8 *)(in_RDI + 0x150) = 0;
  *(undefined1 *)(in_RDI + 0x158) = 0;
  return;
}

Assistant:

ThreadPool::ThreadPool(const string& nameArg)
  : mutex_(),
    notEmpty_(mutex_),
    notFull_(mutex_),
    name_(nameArg),
    maxQueueSize_(0),
    running_(false)
{
}